

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

bool kj::_::pollImpl(PromiseNode *node,WaitScope *waitScope,SourceLocation location)

{
  EventLoop *this;
  FiberPool *this_00;
  bool bVar1;
  long *in_FS_OFFSET;
  FunctionParam<void_()> func;
  Fault f;
  RootEvent doneEvent;
  
  this = waitScope->loop;
  doneEvent.super_Event.loop = (EventLoop *)(*in_FS_OFFSET + -0x28);
  doneEvent.super_Event.next = (Event *)anon_var_dwarf_3d166;
  doneEvent.super_Event.firing = this == (EventLoop *)in_FS_OFFSET[-5];
  doneEvent.super_Event.prev = (Event **)&DAT_00000005;
  if (!doneEvent.super_Event.firing) {
    doneEvent.super_Event._vptr_Event = (_func_int **)this;
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*,kj::EventLoop*&>&,char_const(&)[37]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x81a,FAILED,"&loop == threadLocalEventLoop",
               "_kjCondition,\"WaitScope not valid for this thread.\"",
               (DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> *)&doneEvent,
               (char (*) [37])"WaitScope not valid for this thread.");
    Debug::Fault::fatal(&f);
  }
  doneEvent.super_Event._vptr_Event = (_func_int **)&waitScope->fiber;
  doneEvent.super_Event.firing = (waitScope->fiber).ptr == (FiberBase *)0x0;
  doneEvent.super_Event.loop = (EventLoop *)&kj::none;
  doneEvent.super_Event.next = (Event *)anon_var_dwarf_3d166;
  doneEvent.super_Event.prev = (Event **)&DAT_00000005;
  if (doneEvent.super_Event.firing) {
    f.exception = (Exception *)(CONCAT71(f.exception._1_7_,this->running) ^ 1);
    if (this->running == false) {
      Event::Event((Event *)&doneEvent,location);
      doneEvent.super_Event._vptr_Event = (_func_int **)&PTR_traceEvent_00673708;
      doneEvent.fired = false;
      doneEvent.traceAddr = pollImpl;
      doneEvent.node = node;
      (*(node->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(node,(Exception *)&doneEvent);
      this->running = true;
      this_00 = (waitScope->runningStacksPool).ptr;
      f.exception = (Exception *)&doneEvent;
      if (this_00 == (FiberPool *)0x0) {
        pollImpl::anon_class_24_3_f711dddf::operator()((anon_class_24_3_f711dddf *)&f);
      }
      else {
        func.space._8_8_ = &f;
        func.space._0_8_ = &PTR_operator___00673998;
        FiberPool::runSynchronously(this_00,func);
      }
      bVar1 = doneEvent.fired;
      if (doneEvent.fired != false) {
        EventLoop::setRunnable(this,this->head != (Event *)0x0);
      }
      this->running = false;
      Event::~Event(&doneEvent.super_Event);
      return bVar1;
    }
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[51]>
              ((Fault *)&doneEvent,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x81c,FAILED,"!loop.running",
               "_kjCondition,\"poll() is not allowed from within event callbacks.\"",
               (DebugExpression<bool> *)&f,
               (char (*) [51])"poll() is not allowed from within event callbacks.");
    Debug::Fault::fatal((Fault *)&doneEvent);
  }
  Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::_::FiberBase&>&,kj::None_const&>&,char_const(&)[35]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x81b,FAILED,"waitScope.fiber == kj::none",
             "_kjCondition,\"poll() is not supported in fibers.\"",
             (DebugComparison<kj::Maybe<kj::_::FiberBase_&>_&,_const_kj::None_&> *)&doneEvent,
             (char (*) [35])"poll() is not supported in fibers.");
  Debug::Fault::fatal(&f);
}

Assistant:

bool pollImpl(_::PromiseNode& node, WaitScope& waitScope, SourceLocation location) {
  EventLoop& loop = waitScope.loop;
  KJ_REQUIRE(&loop == threadLocalEventLoop, "WaitScope not valid for this thread.");
  KJ_REQUIRE(waitScope.fiber == kj::none, "poll() is not supported in fibers.");
  KJ_REQUIRE(!loop.running, "poll() is not allowed from within event callbacks.");

  RootEvent doneEvent(&node, reinterpret_cast<void*>(&pollImpl), location);
  node.onReady(&doneEvent);

  loop.running = true;
  KJ_DEFER(loop.running = false);

  waitScope.runOnStackPool([&]() {
    while (!doneEvent.fired) {
      if (!loop.turn()) {
        // No events in the queue.  Poll for I/O.
        loop.poll();

        if (!doneEvent.fired && !loop.isRunnable()) {
          // No progress. Give up.
          node.onReady(nullptr);
          loop.setRunnable(false);
          break;
        }
      }
    }
  });

  if (!doneEvent.fired) {
    return false;
  }

  loop.setRunnable(loop.isRunnable());
  return true;
}